

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O3

XrResult xrGetActionStatePose
                   (XrSession session,XrActionStateGetInfo *getInfo,XrActionStatePose *state)

{
  XrResult XVar1;
  LoaderInstance *loader_instance;
  LoaderInstance *local_98 [16];
  
  XVar1 = ActiveLoaderInstance::Get(local_98,"xrGetActionStatePose");
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    XVar1 = (*((local_98[0]->_dispatch_table)._M_t.
               super___uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
               ._M_t.
               super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
               .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl)->
              GetActionStatePose)(session,getInfo,state);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrGetActionStatePose(
    XrSession                                   session,
    const XrActionStateGetInfo*                 getInfo,
    XrActionStatePose*                          state) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrGetActionStatePose");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->GetActionStatePose(session, getInfo, state);
    }
    return result;
}